

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters_tests.c
# Opt level: O0

void can_strip_multiple_mixed_parameters_to_leave_original_names(void)

{
  char *actual;
  char *actual_string;
  int extraout_var;
  char *file;
  char *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  int iVar1;
  char *in_stack_ffffffffffffffe0;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  names = (CgreenVector *)create_vector_of_names("box_double(a), d(b), c, d,e,box_double(f),d(g)");
  actual = (char *)cgreen_vector_get(names,0);
  create_equal_to_string_constraint("a","\"a\"");
  cgreen::assert_that_<char_const*>
            (in_stack_ffffffffffffffe0,iVar1,in_stack_ffffffffffffffd0,actual,(Constraint *)0x1153cb
            );
  actual_string = (char *)cgreen_vector_get(names,1);
  create_equal_to_string_constraint("b","\"b\"");
  cgreen::assert_that_<char_const*>
            (in_stack_ffffffffffffffe0,iVar1,actual_string,actual,(Constraint *)0x115414);
  cgreen_vector_get(names,2);
  iVar1 = extraout_var;
  create_equal_to_string_constraint("c","\"c\"");
  cgreen::assert_that_<char_const*>
            (in_stack_ffffffffffffffe0,iVar1,actual_string,actual,(Constraint *)0x11545d);
  file = (char *)cgreen_vector_get(names,3);
  create_equal_to_string_constraint("d","\"d\"");
  cgreen::assert_that_<char_const*>(file,iVar1,actual_string,actual,(Constraint *)0x1154a6);
  cgreen_vector_get(names,4);
  create_equal_to_string_constraint("e","\"e\"");
  cgreen::assert_that_<char_const*>(file,iVar1,actual_string,actual,(Constraint *)0x1154ef);
  cgreen_vector_get(names,5);
  create_equal_to_string_constraint("f","\"f\"");
  cgreen::assert_that_<char_const*>(file,iVar1,actual_string,actual,(Constraint *)0x115538);
  cgreen_vector_get(names,6);
  create_equal_to_string_constraint("g","\"g\"");
  cgreen::assert_that_<char_const*>(file,iVar1,actual_string,actual,(Constraint *)0x115581);
  return;
}

Assistant:

Ensure(can_strip_multiple_mixed_parameters_to_leave_original_names) {
    names = create_vector_of_names("box_double(a), d(b), c, d,e,box_double(f),d(g)");
    assert_that((const char *)cgreen_vector_get(names, 0), is_equal_to_string("a"));
    assert_that((const char *)cgreen_vector_get(names, 1), is_equal_to_string("b"));
    assert_that((const char *)cgreen_vector_get(names, 2), is_equal_to_string("c"));
    assert_that((const char *)cgreen_vector_get(names, 3), is_equal_to_string("d"));
    assert_that((const char *)cgreen_vector_get(names, 4), is_equal_to_string("e"));
    assert_that((const char *)cgreen_vector_get(names, 5), is_equal_to_string("f"));
    assert_that((const char *)cgreen_vector_get(names, 6), is_equal_to_string("g"));
}